

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

void __thiscall
AddrManImpl::Unserialize<HashVerifier<DataStream>>(AddrManImpl *this,HashVerifier<DataStream> *s_)

{
  uint256 *nKey;
  int *fmt;
  mapped_type mVar1;
  iterator iVar2;
  _Hash_node_base *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  _Hash_node_base *p_Var7;
  undefined8 uVar8;
  HashVerifier<DataStream> *pHVar9;
  bool bVar10;
  Network NVar11;
  int iVar12;
  uint uVar13;
  _Node_const_iterator<std::pair<const_int,_AddrInfo>,_false,_false> __tmp;
  mapped_type *pmVar14;
  key_type *pkVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  Logger *pLVar18;
  ulong uVar19;
  string *psVar20;
  undefined4 uVar21;
  SerParams *__nbytes;
  int *piVar22;
  int (*paiVar23) [64];
  int *in_R8;
  LogFlags in_R9;
  int iVar24;
  undefined4 uVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  int check_code;
  int nLostUnk;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bucket_entries;
  int nLost;
  uint8_t lowest_compatible;
  uint8_t compat;
  ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> s;
  SerParams ser_params;
  Format format;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  int entry_index;
  uint256 serialized_asmap_checksum;
  uint256 supplied_asmap_checksum;
  Level in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  int iVar28;
  int *piVar29;
  undefined4 in_stack_fffffffffffffe40;
  int local_170;
  int local_16c;
  undefined1 local_168 [16];
  long local_158;
  int local_150;
  byte local_14a;
  Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&> local_149;
  ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> local_148;
  SerParams local_138;
  byte local_129;
  unique_lock<std::mutex> local_128;
  string local_118;
  undefined1 local_f8 [5];
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  undefined1 local_e8 [16];
  direct_or_indirect local_d8;
  undefined4 local_c8;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  uint16_t local_b8;
  rep local_b0;
  ServiceFlags SStack_a8;
  rep local_a0;
  rep rStack_98;
  direct_or_indirect local_90;
  uint local_80;
  undefined8 local_78;
  NodeSeconds local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128._M_owns = false;
  local_128._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_128);
  if ((this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __assert_fail("vRandom.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                  ,0xeb,
                  "void AddrManImpl::Unserialize(Stream &) [Stream = HashVerifier<DataStream>]");
  }
  local_d8.indirect_contents.indirect = (char *)&local_129;
  Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&>::Unserialize<HashVerifier<DataStream>>
            ((Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&> *)
             &local_d8.indirect_contents,s_);
  local_138._1_7_ = 0;
  local_138.super_SerParams.enc._0_1_ = 2 < local_129;
  __nbytes = &local_138;
  local_148.m_params = __nbytes;
  local_148.m_substream = s_;
  DataStream::read(s_->m_source,(int)&local_d8,(void *)0x1,(size_t)__nbytes);
  CSHA256::Write((CSHA256 *)s_,(uchar *)local_d8.direct,1);
  pHVar9 = local_148.m_substream;
  local_149 = (Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&>)local_d8.direct[0];
  if ((byte)local_d8.direct[0] < 0x20) {
    psVar20 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_char,unsigned_char>
              ((string *)&local_d8.indirect_contents,
               (tinyformat *)
               "Corrupted addrman database: The compat value (%u) is lower than the expected minimum value %u."
               ,(char *)&local_149,
               " /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/banman.cpp"
               ,(uchar *)in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar20);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar20,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00852feb;
  }
  local_14a = local_d8.direct[0] - 0x20;
  if (4 < local_14a) {
    psVar20 = (string *)__cxa_allocate_exception(0x20);
    local_d8.direct[0] = local_129;
    local_f8[0] = 4;
    tinyformat::format<unsigned_char,unsigned_char,char[13],unsigned_char>
              (&local_58,
               (tinyformat *)
               "Unsupported format of addrman database: %u. It is compatible with formats >=%u, but the maximum supported by this version of %s is %u."
               ,local_d8.direct,&local_14a,(uchar *)"Bitcoin Core",(char (*) [13])local_f8,
               (uchar *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::ios_base::failure[abi:cxx11]::failure(psVar20);
    *(undefined ***)psVar20 = &PTR__failure_013b58b0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar20,&InvalidAddrManVersionError::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00852feb;
  }
  nKey = &this->nKey;
  DataStream::read((local_148.m_substream)->m_source,(int)nKey,(void *)0x20,(size_t)__nbytes);
  CSHA256::Write((CSHA256 *)pHVar9,(uchar *)nKey,0x20);
  pHVar9 = local_148.m_substream;
  DataStream::read((local_148.m_substream)->m_source,(int)&local_d8,(void *)0x4,(size_t)__nbytes);
  CSHA256::Write((CSHA256 *)pHVar9,(uchar *)local_d8.direct,4);
  pHVar9 = local_148.m_substream;
  this->nNew = local_d8._0_4_;
  DataStream::read((local_148.m_substream)->m_source,(int)&local_d8,(void *)0x4,(size_t)__nbytes);
  CSHA256::Write((CSHA256 *)pHVar9,(uchar *)local_d8.direct,4);
  pHVar9 = local_148.m_substream;
  piVar22 = &this->nTried;
  *piVar22 = local_d8._0_4_;
  DataStream::read((local_148.m_substream)->m_source,(int)&local_d8,(void *)0x4,(size_t)piVar22);
  CSHA256::Write((CSHA256 *)pHVar9,(uchar *)local_d8.direct,4);
  fmt = &this->nNew;
  uVar21 = local_d8._0_4_ ^ 0x40000000;
  if (local_129 == 0) {
    uVar21 = local_d8._0_4_;
  }
  if (0x10000 < (uint)*fmt) {
    psVar20 = (string *)__cxa_allocate_exception(0x20);
    local_f8._0_4_ = 0x10000;
    tinyformat::format<int,int>
              ((string *)&local_d8.indirect_contents,
               (tinyformat *)"Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
               (char *)fmt,(int *)local_f8,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar20);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar20,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00852feb;
  }
  uVar13 = *piVar22;
  if (0x4000 < uVar13) {
    psVar20 = (string *)__cxa_allocate_exception(0x20);
    local_f8._0_4_ = 0x4000;
    tinyformat::format<int,int>
              ((string *)&local_d8.indirect_contents,
               (tinyformat *)"Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
               (char *)piVar22,(int *)local_f8,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar20);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar20,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_00852feb;
  }
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffff0c;
  _local_f8 = auVar4 << 0x20;
  iVar28 = 0;
  iVar24 = 0;
  if (*fmt != 0) {
    do {
      pmVar14 = std::__detail::
                _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->mapInfo,(key_type *)local_f8);
      local_d8.indirect_contents.indirect = (char *)&pmVar14->m_last_success;
      in_R8 = &pmVar14->nAttempts;
      ActionUnserialize::
      SerReadWriteMany<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                (&local_148,&pmVar14->super_CAddress,&pmVar14->source,
                 (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                  *)&local_d8.indirect_contents,in_R8);
      uVar25 = local_f8._0_4_;
      pkVar15 = (key_type *)
                std::__detail::
                _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->mapAddr,(key_type *)pmVar14);
      *pkVar15 = uVar25;
      iVar2._M_current =
           (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pmVar14->nRandomPos =
           (int)((ulong)((long)iVar2._M_current -
                        (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      if (iVar2._M_current ==
          (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->vRandom,iVar2,(int *)local_f8);
      }
      else {
        *iVar2._M_current = local_f8._0_4_;
        (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      NVar11 = CNetAddr::GetNetwork((CNetAddr *)pmVar14);
      local_d8._0_4_ = NVar11;
      pmVar16 = std::__detail::
                _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->m_network_counts,(key_type *)local_d8.direct);
      pmVar16->n_new = pmVar16->n_new + 1;
      iVar12 = local_f8._0_4_ + NET_IPV4;
      local_f8._0_4_ = iVar12;
      iVar24 = *fmt;
    } while (iVar12 < iVar24);
    uVar13 = *piVar22;
  }
  this->nIdCount = iVar24;
  local_150 = 0;
  if (0 < (int)uVar13) {
    piVar29 = &this->nIdCount;
    iVar28 = 0;
    iVar24 = 0;
    do {
      AddrInfo::AddrInfo((AddrInfo *)&local_d8.indirect_contents);
      _local_f8 = &local_70;
      in_R8 = (int *)&uStack_68;
      ActionUnserialize::
      SerReadWriteMany<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                (&local_148,(CAddress *)&local_d8.indirect_contents,
                 (CNetAddr *)&local_90.indirect_contents,
                 (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                  *)local_f8,in_R8);
      iVar12 = AddrInfo::GetTriedBucket
                         ((AddrInfo *)&local_d8.indirect_contents,nKey,this->m_netgroupman);
      uVar13 = AddrInfo::GetBucketPosition
                         ((AddrInfo *)&local_d8.indirect_contents,nKey,false,iVar12);
      bVar10 = CNetAddr::IsValid((CNetAddr *)&local_d8.indirect_contents);
      if (bVar10) {
        lVar6 = (ulong)(uint)(iVar12 << 8) + 0x174;
        if (*(int *)((long)this->vvTried[0] + (ulong)uVar13 * 4 + lVar6 + -0x174) != -1)
        goto LAB_00852620;
        iVar2._M_current =
             (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uStack_5c = (undefined4)
                    ((ulong)((long)iVar2._M_current -
                            (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_60 = CONCAT31(local_60._1_3_,1);
        if (iVar2._M_current ==
            (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->vRandom,iVar2,piVar29);
        }
        else {
          *iVar2._M_current = this->nIdCount;
          (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        pmVar14 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->mapInfo,piVar29);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)pmVar14,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents);
        uVar25 = CONCAT13(cStack_bd,CONCAT12(cStack_be,CONCAT11(cStack_bf,cStack_c0)));
        (pmVar14->super_CAddress).super_CService.super_CNetAddr.m_net = uVar25;
        (pmVar14->super_CAddress).super_CService.super_CNetAddr.m_scope_id =
             (int)(CONCAT17(cStack_b9,
                            CONCAT16(cStack_ba,CONCAT15(cStack_bb,CONCAT14(cStack_bc,uVar25)))) >>
                  0x20);
        (pmVar14->super_CAddress).super_CService.port = local_b8;
        (pmVar14->super_CAddress).nTime.__d.__r = local_b0;
        (pmVar14->super_CAddress).nServices = SStack_a8;
        (pmVar14->m_last_try).__d.__r = local_a0;
        (pmVar14->m_last_count_attempt).__d.__r = rStack_98;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(pmVar14->source).m_addr,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_90.indirect_contents);
        (pmVar14->source).m_net = (undefined4)local_78;
        (pmVar14->source).m_scope_id = local_78._4_4_;
        (pmVar14->m_last_success).__d.__r = (rep)local_70.__d.__r;
        pmVar14->nAttempts = (undefined4)uStack_68;
        pmVar14->nRefCount = uStack_68._4_4_;
        pmVar14->fInTried = (bool)(char)local_60;
        *(int3 *)&pmVar14->field_0x79 = (int3)((uint)local_60 >> 8);
        pmVar14->nRandomPos = uStack_5c;
        mVar1 = *piVar29;
        pmVar17 = std::__detail::
                  _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->mapAddr,(key_type *)&local_d8.indirect_contents);
        *pmVar17 = mVar1;
        iVar12 = *piVar29;
        *(int *)((long)this->vvTried[0] + (ulong)uVar13 * 4 + lVar6 + -0x174) = iVar12;
        *piVar29 = iVar12 + 1;
        NVar11 = CNetAddr::GetNetwork((CNetAddr *)&local_d8.indirect_contents);
        local_f8._0_4_ = NVar11;
        pmVar16 = std::__detail::
                  _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->m_network_counts,(key_type *)local_f8);
        pmVar16->n_tried = pmVar16->n_tried + 1;
      }
      else {
LAB_00852620:
        iVar28 = iVar28 + 1;
        local_150 = iVar28;
      }
      if (0x10 < local_80) {
        free(local_90.indirect_contents.indirect);
        local_90.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_c8) {
        free(local_d8.indirect_contents.indirect);
      }
      iVar24 = iVar24 + 1;
      uVar13 = *piVar22;
    } while (iVar24 < (int)uVar13);
  }
  iVar24 = (int)in_R8;
  *piVar22 = uVar13 - iVar28;
  local_168 = (undefined1  [16])0x0;
  local_158 = 0;
  auVar5._12_4_ = 0;
  auVar5._0_12_ = stack0xffffffffffffff0c;
  _local_f8 = auVar5 << 0x20;
  piVar29 = piVar22;
  if (0 < (int)uVar21) {
    do {
      pHVar9 = local_148.m_substream;
      iVar24 = (int)&local_d8;
      DataStream::read((local_148.m_substream)->m_source,iVar24,(void *)0x4,(size_t)piVar22);
      CSHA256::Write((CSHA256 *)pHVar9,(uchar *)local_d8.direct,4);
      uVar25 = local_d8._0_4_;
      if (0 < (int)local_d8._0_4_) {
        do {
          pHVar9 = local_148.m_substream;
          local_118._M_dataplus._M_p._0_4_ = 0;
          DataStream::read((local_148.m_substream)->m_source,iVar24,(void *)0x4,(size_t)piVar22);
          CSHA256::Write((CSHA256 *)pHVar9,(uchar *)local_d8.direct,4);
          local_118._M_dataplus._M_p._0_4_ = local_d8._0_4_;
          if ((-1 < (int)local_d8._0_4_) && (piVar22 = fmt, (int)local_d8._0_4_ < *fmt)) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<int&,int&>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_168,
                       (int *)local_f8,(int *)&local_118);
          }
          uVar25 = uVar25 + -1;
        } while (uVar25 != 0);
      }
      iVar24 = (int)in_R8;
      iVar12 = local_f8._0_4_ + NET_IPV4;
      local_f8._0_4_ = iVar12;
    } while (iVar12 < (int)uVar21);
  }
  NetGroupManager::GetAsmapChecksum((uint256 *)&local_d8.indirect_contents,this->m_netgroupman);
  pHVar9 = local_148.m_substream;
  local_e8 = (undefined1  [16])0x0;
  _local_f8 = (undefined1  [16])0x0;
  if (1 < local_129) {
    DataStream::read((local_148.m_substream)->m_source,(int)local_f8,(void *)0x20,(size_t)piVar22);
    CSHA256::Write((CSHA256 *)pHVar9,local_f8,0x20);
  }
  if (uVar21 == 0x400) {
    auVar27[0] = -((char)local_c8 == local_e8[0]);
    auVar27[1] = -(local_c8._1_1_ == local_e8[1]);
    auVar27[2] = -(local_c8._2_1_ == local_e8[2]);
    auVar27[3] = -(local_c8._3_1_ == local_e8[3]);
    auVar27[4] = -(cStack_c4 == local_e8[4]);
    auVar27[5] = -(cStack_c3 == local_e8[5]);
    auVar27[6] = -(cStack_c2 == local_e8[6]);
    auVar27[7] = -(cStack_c1 == local_e8[7]);
    auVar27[8] = -(cStack_c0 == local_e8[8]);
    auVar27[9] = -(cStack_bf == local_e8[9]);
    auVar27[10] = -(cStack_be == local_e8[10]);
    auVar27[0xb] = -(cStack_bd == local_e8[0xb]);
    auVar27[0xc] = -(cStack_bc == local_e8[0xc]);
    auVar27[0xd] = -(cStack_bb == local_e8[0xd]);
    auVar27[0xe] = -(cStack_ba == local_e8[0xe]);
    auVar27[0xf] = -(cStack_b9 == local_e8[0xf]);
    auVar26[0] = -(local_d8.direct[0] == local_f8[0]);
    auVar26[1] = -(local_d8.direct[1] == local_f8[1]);
    auVar26[2] = -(local_d8.direct[2] == local_f8[2]);
    auVar26[3] = -(local_d8.direct[3] == local_f8[3]);
    auVar26[4] = -(local_d8.direct[4] == local_f8[4]);
    auVar26[5] = -(local_d8.direct[5] == cStack_f3);
    auVar26[6] = -(local_d8.direct[6] == cStack_f2);
    auVar26[7] = -(local_d8.direct[7] == cStack_f1);
    auVar26[8] = -(local_d8.direct[8] == cStack_f0);
    auVar26[9] = -(local_d8.direct[9] == cStack_ef);
    auVar26[10] = -(local_d8.direct[10] == cStack_ee);
    auVar26[0xb] = -(local_d8.direct[0xb] == cStack_ed);
    auVar26[0xc] = -(local_d8.direct[0xc] == cStack_ec);
    auVar26[0xd] = -(local_d8.direct[0xd] == cStack_eb);
    auVar26[0xe] = -(local_d8.direct[0xe] == cStack_ea);
    auVar26[0xf] = -(local_d8.direct[0xf] == cStack_e9);
    auVar26 = auVar26 & auVar27;
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00852965;
    piVar29 = (int *)CONCAT44((int)((ulong)piVar29 >> 0x20),0xff01);
  }
  else {
LAB_00852965:
    pLVar18 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar18,ADDRMAN,Debug);
    if (bVar10) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
      source_file._M_len = 0x54;
      logging_function._M_str = "Unserialize";
      logging_function._M_len = 0xb;
      ::LogPrintf_<>(logging_function,source_file,iVar24,in_R9,in_stack_fffffffffffffe28,
                     (char *)CONCAT44(iVar28,in_stack_fffffffffffffe30));
    }
    piVar29 = (int *)((ulong)piVar29 & 0xffffffff00000000);
  }
  uVar8 = local_168._8_8_;
  if (local_168._0_8_ != local_168._8_8_) {
    piVar22 = (int *)local_168._0_8_;
    do {
      iVar24 = *piVar22;
      local_118._M_dataplus._M_p._0_4_ = piVar22[1];
      pmVar14 = std::__detail::
                _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->mapInfo,(key_type *)&local_118);
      bVar10 = CNetAddr::IsValid((CNetAddr *)pmVar14);
      if ((bVar10) && (pmVar14->nRefCount < 8)) {
        uVar13 = AddrInfo::GetBucketPosition(pmVar14,nKey,true,iVar24);
        if ((char)piVar29 == '\0') {
LAB_00852a3b:
          iVar24 = AddrInfo::GetNewBucket(pmVar14,nKey,&pmVar14->source,this->m_netgroupman);
          uVar13 = AddrInfo::GetBucketPosition(pmVar14,nKey,true,iVar24);
          paiVar23 = (int (*) [64])((long)this->vvNew[0] + (ulong)(uint)(iVar24 << 8));
          uVar19 = (ulong)uVar13;
          if ((*paiVar23)[uVar19] != -1) goto LAB_00852a92;
        }
        else {
          paiVar23 = this->vvNew + iVar24;
          uVar19 = (ulong)uVar13;
          if ((*paiVar23)[uVar19] != -1) goto LAB_00852a3b;
        }
        (*paiVar23)[uVar19] = (int)local_118._M_dataplus._M_p;
        pmVar14->nRefCount = pmVar14->nRefCount + 1;
      }
LAB_00852a92:
      piVar22 = piVar22 + 2;
    } while (piVar22 != (int *)uVar8);
  }
  local_16c = 0;
  iVar24 = 0;
  p_Var7 = (this->mapInfo)._M_h._M_before_begin._M_nxt;
  while (p_Var7 != (_Hash_node_base *)0x0) {
    if ((*(char *)&p_Var7[0x11]._M_nxt == '\0') && (*(int *)((long)&p_Var7[0x10]._M_nxt + 4) == 0))
    {
      p_Var3 = p_Var7->_M_nxt;
      Delete(this,*(int *)&p_Var7[1]._M_nxt);
      iVar24 = iVar24 + 1;
      p_Var7 = p_Var3;
      local_16c = iVar24;
    }
    else {
      p_Var7 = p_Var7->_M_nxt;
    }
  }
  if (iVar24 + iVar28 != 0 && SCARRY4(iVar24,iVar28) == iVar24 + iVar28 < 0) {
    pLVar18 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar18,ADDRMAN,Debug);
    if (bVar10) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
      source_file_00._M_len = 0x54;
      logging_function_00._M_str = "Unserialize";
      logging_function_00._M_len = 0xb;
      LogPrintf_<int,int>(logging_function_00,source_file_00,(int)&local_16c,(LogFlags)&local_150,
                          in_stack_fffffffffffffe28,
                          (char *)CONCAT44(iVar28,in_stack_fffffffffffffe30),piVar29,
                          (int *)CONCAT44(uVar21,in_stack_fffffffffffffe40));
    }
  }
  local_170 = CheckAddrman(this);
  if (local_170 == 0) {
    if ((void *)local_168._0_8_ != (void *)0x0) {
      operator_delete((void *)local_168._0_8_,local_158 - local_168._0_8_);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_128);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    psVar20 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<int>
              (&local_118,"Corrupt data. Consistency check failed with code %s",&local_170);
    std::ios_base::failure[abi:cxx11]::failure(psVar20);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar20,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_00852feb:
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Unserialize(Stream& s_)
{
    LOCK(cs);

    assert(vRandom.empty());

    Format format;
    s_ >> Using<CustomUintFormatter<1>>(format);

    const auto ser_params = (format >= Format::V3_BIP155 ? CAddress::V2_DISK : CAddress::V1_DISK);
    ParamsStream s{s_, ser_params};

    uint8_t compat;
    s >> compat;
    if (compat < INCOMPATIBILITY_BASE) {
        throw std::ios_base::failure(strprintf(
            "Corrupted addrman database: The compat value (%u) "
            "is lower than the expected minimum value %u.",
            compat, INCOMPATIBILITY_BASE));
    }
    const uint8_t lowest_compatible = compat - INCOMPATIBILITY_BASE;
    if (lowest_compatible > FILE_FORMAT) {
        throw InvalidAddrManVersionError(strprintf(
            "Unsupported format of addrman database: %u. It is compatible with formats >=%u, "
            "but the maximum supported by this version of %s is %u.",
            uint8_t{format}, lowest_compatible, PACKAGE_NAME, uint8_t{FILE_FORMAT}));
    }

    s >> nKey;
    s >> nNew;
    s >> nTried;
    int nUBuckets = 0;
    s >> nUBuckets;
    if (format >= Format::V1_DETERMINISTIC) {
        nUBuckets ^= (1 << 30);
    }

    if (nNew > ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nNew < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                    nNew,
                    ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    if (nTried > ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nTried < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                    nTried,
                    ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    // Deserialize entries from the new table.
    for (int n = 0; n < nNew; n++) {
        AddrInfo& info = mapInfo[n];
        s >> info;
        mapAddr[info] = n;
        info.nRandomPos = vRandom.size();
        vRandom.push_back(n);
        m_network_counts[info.GetNetwork()].n_new++;
    }
    nIdCount = nNew;

    // Deserialize entries from the tried table.
    int nLost = 0;
    for (int n = 0; n < nTried; n++) {
        AddrInfo info;
        s >> info;
        int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
        int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);
        if (info.IsValid()
                && vvTried[nKBucket][nKBucketPos] == -1) {
            info.nRandomPos = vRandom.size();
            info.fInTried = true;
            vRandom.push_back(nIdCount);
            mapInfo[nIdCount] = info;
            mapAddr[info] = nIdCount;
            vvTried[nKBucket][nKBucketPos] = nIdCount;
            nIdCount++;
            m_network_counts[info.GetNetwork()].n_tried++;
        } else {
            nLost++;
        }
    }
    nTried -= nLost;

    // Store positions in the new table buckets to apply later (if possible).
    // An entry may appear in up to ADDRMAN_NEW_BUCKETS_PER_ADDRESS buckets,
    // so we store all bucket-entry_index pairs to iterate through later.
    std::vector<std::pair<int, int>> bucket_entries;

    for (int bucket = 0; bucket < nUBuckets; ++bucket) {
        int num_entries{0};
        s >> num_entries;
        for (int n = 0; n < num_entries; ++n) {
            int entry_index{0};
            s >> entry_index;
            if (entry_index >= 0 && entry_index < nNew) {
                bucket_entries.emplace_back(bucket, entry_index);
            }
        }
    }

    // If the bucket count and asmap checksum haven't changed, then attempt
    // to restore the entries to the buckets/positions they were in before
    // serialization.
    uint256 supplied_asmap_checksum{m_netgroupman.GetAsmapChecksum()};
    uint256 serialized_asmap_checksum;
    if (format >= Format::V2_ASMAP) {
        s >> serialized_asmap_checksum;
    }
    const bool restore_bucketing{nUBuckets == ADDRMAN_NEW_BUCKET_COUNT &&
        serialized_asmap_checksum == supplied_asmap_checksum};

    if (!restore_bucketing) {
        LogDebug(BCLog::ADDRMAN, "Bucketing method was updated, re-bucketing addrman entries from disk\n");
    }

    for (auto bucket_entry : bucket_entries) {
        int bucket{bucket_entry.first};
        const int entry_index{bucket_entry.second};
        AddrInfo& info = mapInfo[entry_index];

        // Don't store the entry in the new bucket if it's not a valid address for our addrman
        if (!info.IsValid()) continue;

        // The entry shouldn't appear in more than
        // ADDRMAN_NEW_BUCKETS_PER_ADDRESS. If it has already, just skip
        // this bucket_entry.
        if (info.nRefCount >= ADDRMAN_NEW_BUCKETS_PER_ADDRESS) continue;

        int bucket_position = info.GetBucketPosition(nKey, true, bucket);
        if (restore_bucketing && vvNew[bucket][bucket_position] == -1) {
            // Bucketing has not changed, using existing bucket positions for the new table
            vvNew[bucket][bucket_position] = entry_index;
            ++info.nRefCount;
        } else {
            // In case the new table data cannot be used (bucket count wrong or new asmap),
            // try to give them a reference based on their primary source address.
            bucket = info.GetNewBucket(nKey, m_netgroupman);
            bucket_position = info.GetBucketPosition(nKey, true, bucket);
            if (vvNew[bucket][bucket_position] == -1) {
                vvNew[bucket][bucket_position] = entry_index;
                ++info.nRefCount;
            }
        }
    }

    // Prune new entries with refcount 0 (as a result of collisions or invalid address).
    int nLostUnk = 0;
    for (auto it = mapInfo.cbegin(); it != mapInfo.cend(); ) {
        if (it->second.fInTried == false && it->second.nRefCount == 0) {
            const auto itCopy = it++;
            Delete(itCopy->first);
            ++nLostUnk;
        } else {
            ++it;
        }
    }
    if (nLost + nLostUnk > 0) {
        LogDebug(BCLog::ADDRMAN, "addrman lost %i new and %i tried addresses due to collisions or invalid addresses\n", nLostUnk, nLost);
    }

    const int check_code{CheckAddrman()};
    if (check_code != 0) {
        throw std::ios_base::failure(strprintf(
            "Corrupt data. Consistency check failed with code %s",
            check_code));
    }
}